

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,true>>
::insert_hint_multi<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
          (btree<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,true>>
           *this,iterator position,pair<const_int,_phmap::test_internal::MovableOnlyInstance> *v)

{
  int *x;
  bool bVar1;
  key_type *pkVar2;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
  *this_00;
  iterator iter;
  iterator iVar3;
  iterator iVar4;
  byte local_131;
  byte local_122;
  byte local_121;
  undefined4 uStack_f0;
  iterator local_d8;
  undefined1 auStack_c8 [8];
  iterator next;
  iterator local_88;
  undefined1 auStack_78 [8];
  iterator prev;
  iterator local_50;
  int *local_40;
  key_type *key;
  pair<const_int,_phmap::test_internal::MovableOnlyInstance> *v_local;
  btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *this_local;
  iterator position_local;
  int local_10;
  
  this_local = (btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                *)position.node;
  position_local.node._0_4_ = position.position;
  key = &v->first;
  v_local = (pair<const_int,_phmap::test_internal::MovableOnlyInstance> *)this;
  bVar1 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
          ::empty((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   *)this);
  if (!bVar1) {
    local_40 = map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>
               ::key((value_type *)key);
    iVar3 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            ::end((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   *)this);
    local_50.node = iVar3.node;
    local_50.position = iVar3.position;
    bVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
            ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                          *)&this_local,&local_50);
    local_121 = 1;
    if (!bVar1) {
      pkVar2 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
               ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                      *)&this_local);
      bVar1 = compare_keys<int,int>(this,pkVar2,local_40);
      local_121 = bVar1 ^ 0xff;
    }
    if ((local_121 & 1) == 0) {
      next.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   *)CONCAT44(position_local.node._4_4_,(int)position_local.node);
      auStack_c8 = (undefined1  [8])this_local;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                    *)auStack_c8);
      iVar3 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
              ::end((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                     *)this);
      local_d8.node = iVar3.node;
      local_d8.position = iVar3.position;
      bVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
              ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                            *)auStack_c8,&local_d8);
      local_131 = 1;
      if (!bVar1) {
        pkVar2 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                 ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                        *)auStack_c8);
        bVar1 = compare_keys<int,int>(this,pkVar2,local_40);
        local_131 = bVar1 ^ 0xff;
      }
      if ((local_131 & 1) != 0) {
        uStack_f0 = SUB84(next.node,0);
        iter.position = uStack_f0;
        iter.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                     *)auStack_c8;
        iter._12_4_ = 0;
        iVar3 = internal_emplace<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                          (this,iter,
                           (pair<const_int,_phmap::test_internal::MovableOnlyInstance> *)key);
        position_local._8_8_ = iVar3.node;
        local_10 = iVar3.position;
        goto LAB_0041ea9b;
      }
    }
    else {
      prev.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   *)CONCAT44(position_local.node._4_4_,(int)position_local.node);
      auStack_78 = (undefined1  [8])this_local;
      iVar3 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
              ::begin((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                       *)this);
      local_88.node = iVar3.node;
      local_88.position = iVar3.position;
      bVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
              ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                            *)&this_local,&local_88);
      x = local_40;
      local_122 = 1;
      if (!bVar1) {
        this_00 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                  ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                                *)auStack_78);
        pkVar2 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                 ::key(this_00);
        bVar1 = compare_keys<int,int>(this,x,pkVar2);
        local_122 = bVar1 ^ 0xff;
      }
      if ((local_122 & 1) != 0) {
        iVar3.position = (int)position_local.node;
        iVar3.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                      *)this_local;
        iVar3._12_4_ = 0;
        iVar3 = internal_emplace<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                          (this,iVar3,
                           (pair<const_int,_phmap::test_internal::MovableOnlyInstance> *)key);
        position_local._8_8_ = iVar3.node;
        local_10 = iVar3.position;
        goto LAB_0041ea9b;
      }
    }
  }
  iVar3 = insert_multi<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                    (this,(pair<const_int,_phmap::test_internal::MovableOnlyInstance> *)key);
  position_local._8_8_ = iVar3.node;
  local_10 = iVar3.position;
LAB_0041ea9b:
  iVar4.position = local_10;
  iVar4.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                *)position_local._8_8_;
  iVar4._12_4_ = 0;
  return iVar4;
}

Assistant:

auto btree<P>::insert_hint_multi(iterator position, ValueType &&v) -> iterator {
        if (!empty()) {
            const key_type &key = params_type::key(v);
            if (position == end() || !compare_keys(position.key(), key)) {
                iterator prev = position;
                if (position == begin() || !compare_keys(key, (--prev).key())) {
                    // prev.key() <= key <= position.key()
                    return internal_emplace(position, std::forward<ValueType>(v));
                }
            } else {
                iterator next = position;
                ++next;
                if (next == end() || !compare_keys(next.key(), key)) {
                    // position.key() < key <= next.key()
                    return internal_emplace(next, std::forward<ValueType>(v));
                }
            }
        }
        return insert_multi(std::forward<ValueType>(v));
    }